

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<QBrush>::copyAppend(QGenericArrayOps<QBrush> *this,QBrush *b,QBrush *e)

{
  QBrush *this_00;
  ulong in_RDX;
  ulong in_RSI;
  QBrush *in_RDI;
  QBrush *data;
  ulong local_10;
  
  if (in_RSI != in_RDX) {
    this_00 = QArrayDataPointer<QBrush>::begin((QArrayDataPointer<QBrush> *)0x315f07);
    local_10 = in_RSI;
    while (local_10 < in_RDX) {
      QBrush::QBrush(this_00,in_RDI);
      local_10 = local_10 + 8;
      in_RDI[2].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl =
           ((QBrushData *)
           ((long)&(in_RDI[2].d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                    _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl)->ref + 1))._M_head_impl
      ;
    }
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }